

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O0

void ihevc_itrans_8x8(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                     WORD32 i4_shift,WORD32 zero_cols)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  short *in_RDI;
  undefined4 in_R8D;
  uint in_R9D;
  WORD32 add;
  WORD32 eo [2];
  WORD32 ee [2];
  WORD32 o [4];
  WORD32 e [4];
  WORD32 k;
  WORD32 j;
  undefined2 local_6c;
  undefined2 local_68;
  undefined2 local_64;
  undefined2 local_60;
  int aiStack_48 [11];
  undefined4 local_1c;
  int local_18;
  int local_14;
  void *local_10;
  short *local_8;
  
  iVar1 = 1 << ((char)in_R8D - 1U & 0x1f);
  aiStack_48[10] = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (aiStack_48[9] = 0; aiStack_48[9] < 8; aiStack_48[9] = aiStack_48[9] + 1) {
    if ((aiStack_48[10] & 1U) == 1) {
      memset(local_10,0,0x10);
    }
    else {
      for (aiStack_48[8] = 0; aiStack_48[8] < 4; aiStack_48[8] = aiStack_48[8] + 1) {
        aiStack_48[aiStack_48[8]] =
             (int)g_ai2_ihevc_trans_8[1][aiStack_48[8]] * (int)local_8[local_14] +
             (int)g_ai2_ihevc_trans_8[3][aiStack_48[8]] * (int)local_8[local_14 * 3] +
             (int)g_ai2_ihevc_trans_8[5][aiStack_48[8]] * (int)local_8[local_14 * 5] +
             (int)g_ai2_ihevc_trans_8[7][aiStack_48[8]] * (int)local_8[local_14 * 7];
      }
      iVar2 = local_8[local_14 << 1] * 0x53 + local_8[local_14 * 6] * 0x24;
      iVar3 = local_8[local_14 << 1] * 0x24 + local_8[local_14 * 6] * -0x53;
      iVar4 = *local_8 * 0x40 + local_8[local_14 << 2] * 0x40;
      iVar5 = *local_8 * 0x40 + local_8[local_14 << 2] * -0x40;
      aiStack_48[4] = iVar4 + iVar2;
      aiStack_48[7] = iVar4 - iVar2;
      aiStack_48[5] = iVar5 + iVar3;
      aiStack_48[6] = iVar5 - iVar3;
      for (aiStack_48[8] = 0; aiStack_48[8] < 4; aiStack_48[8] = aiStack_48[8] + 1) {
        bVar6 = (byte)local_1c;
        if (aiStack_48[(long)aiStack_48[8] + 4] + aiStack_48[aiStack_48[8]] + iVar1 >>
            (bVar6 & 0x1f) < 0x8000) {
          if (aiStack_48[(long)aiStack_48[8] + 4] + aiStack_48[aiStack_48[8]] + iVar1 >>
              (bVar6 & 0x1f) < -0x8000) {
            local_64 = 0x8000;
          }
          else {
            local_64 = (undefined2)
                       (aiStack_48[(long)aiStack_48[8] + 4] + aiStack_48[aiStack_48[8]] + iVar1 >>
                       (bVar6 & 0x1f));
          }
          local_60 = local_64;
        }
        else {
          local_60 = 0x7fff;
        }
        *(undefined2 *)((long)local_10 + (long)aiStack_48[8] * 2) = local_60;
        if ((aiStack_48[(long)(3 - aiStack_48[8]) + 4] - aiStack_48[3 - aiStack_48[8]]) + iVar1 >>
            (bVar6 & 0x1f) < 0x8000) {
          if ((aiStack_48[(long)(3 - aiStack_48[8]) + 4] - aiStack_48[3 - aiStack_48[8]]) + iVar1 >>
              (bVar6 & 0x1f) < -0x8000) {
            local_6c = 0x8000;
          }
          else {
            local_6c = (undefined2)
                       ((aiStack_48[(long)(3 - aiStack_48[8]) + 4] - aiStack_48[3 - aiStack_48[8]])
                        + iVar1 >> (bVar6 & 0x1f));
          }
          local_68 = local_6c;
        }
        else {
          local_68 = 0x7fff;
        }
        *(undefined2 *)((long)local_10 + (long)(aiStack_48[8] + 4) * 2) = local_68;
      }
    }
    local_8 = local_8 + 1;
    local_10 = (void *)((long)local_10 + (long)local_18 * 2);
    aiStack_48[10] = aiStack_48[10] >> 1;
  }
  return;
}

Assistant:

void ihevc_itrans_8x8(WORD16 *pi2_src,
                      WORD16 *pi2_dst,
                      WORD32 src_strd,
                      WORD32 dst_strd,
                      WORD32 i4_shift,
                      WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_8; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_8 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 4; k++)
            {
                o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_8[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_8[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_8[7][k]
                                                * pi2_src[7 * src_strd];
            }

            eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                            + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
            eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                            + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
            ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
            ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            e[0] = ee[0] + eo[0];
            e[3] = ee[0] - eo[0];
            e[1] = ee[1] + eo[1];
            e[2] = ee[1] - eo[1];
            for(k = 0; k < 4; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 4] =
                                CLIP_S16(((e[3 - k] - o[3 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}